

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O0

void dtoa_milo(double value,char *buffer)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_20;
  int local_1c;
  int K;
  int length;
  char *buffer_local;
  double value_local;
  
  _K = buffer;
  buffer_local = (char *)value;
  iVar1 = std::isnan(value);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!std::isnan(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                  ,0x191,"void dtoa_milo(double, char *)");
  }
  iVar1 = std::isinf((double)buffer_local);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!std::isinf(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                  ,0x192,"void dtoa_milo(double, char *)");
  }
  dVar2 = ABS((double)buffer_local);
  dVar3 = std::numeric_limits<double>::epsilon();
  if (dVar3 <= dVar2) {
    if ((double)buffer_local < 0.0) {
      *_K = '-';
      buffer_local = (char *)((ulong)buffer_local ^ 0x8000000000000000);
      _K = _K + 1;
    }
    Grisu2((double)buffer_local,_K,&local_1c,&local_20);
    Prettify(_K,local_1c,local_20);
  }
  else {
    builtin_strncpy(_K,"0.0",4);
  }
  return;
}

Assistant:

inline void dtoa_milo(double value, char* buffer) {
	// Not handling NaN and inf
	assert(!std::isnan(value));
	assert(!std::isinf(value));

	if (std::fabs(value) < std::numeric_limits<double>::epsilon()) {
		buffer[0] = '0';
		buffer[1] = '.';
		buffer[2] = '0';
		buffer[3] = '\0';
	}
	else {
		if (value < 0) {
			*buffer++ = '-';
			value = -value;
		}
		int length, K;
		Grisu2(value, buffer, &length, &K);
		Prettify(buffer, length, K);
	}
}